

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,unsigned_long>
          (Thread *this)

{
  Value VVar1;
  Value value;
  
  VVar1 = Pop(this);
  value.field_0._8_8_ = VVar1.field_0.i64_;
  value.field_0.i64_ = VVar1.field_0.i64_;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}